

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O1

uint32_t __thiscall duckdb::DecryptionTransport::Finalize(DecryptionTransport *this)

{
  int iVar1;
  EncryptionState *pEVar2;
  undefined4 extraout_var;
  InternalException *pIVar3;
  InvalidInputException *this_00;
  data_t computed_tag [16];
  string local_58;
  undefined1 local_38 [24];
  
  if (this->read_buffer_offset != this->read_buffer_size) {
    pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "DecryptionTransport::Finalize was called with bytes remaining in read buffer: \nread buffer offset: %d, read buffer size: %d"
               ,"");
    InternalException::InternalException<unsigned_int,unsigned_int>
              (pIVar3,&local_58,this->read_buffer_offset,this->read_buffer_size);
    __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = (*this->trans->_vptr_TTransport[6])(this->trans,local_38,0x10);
  this->transport_remaining = this->transport_remaining - iVar1;
  pEVar2 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
  iVar1 = (*pEVar2->_vptr_EncryptionState[5])(pEVar2,this->read_buffer,0,local_38,0x10);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    if (this->transport_remaining == 0) {
      return this->total_bytes + 4;
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Encoded ciphertext length differs from actual ciphertext length"
               ,"");
    InvalidInputException::InvalidInputException(this_00,&local_58);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "DecryptionTransport::Finalize was called with bytes remaining in AES context out","");
  InternalException::InternalException(pIVar3,&local_58);
  __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t Finalize() {

		if (read_buffer_offset != read_buffer_size) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in read buffer: \n"
			                        "read buffer offset: %d, read buffer size: %d",
			                        read_buffer_offset, read_buffer_size);
		}

		data_t computed_tag[ParquetCrypto::TAG_BYTES];
		transport_remaining -= trans.read(computed_tag, ParquetCrypto::TAG_BYTES);
		if (aes->Finalize(read_buffer, 0, computed_tag, ParquetCrypto::TAG_BYTES) != 0) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in AES context out");
		}

		if (transport_remaining != 0) {
			throw InvalidInputException("Encoded ciphertext length differs from actual ciphertext length");
		}

		return ParquetCrypto::LENGTH_BYTES + total_bytes;
	}